

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v8::detail::count_digits<4,unsigned_long>(unsigned_long n)

{
  int num_digits;
  unsigned_long n_local;
  
  num_digits = 0;
  n_local = n;
  do {
    num_digits = num_digits + 1;
    n_local = n_local >> 4;
  } while (n_local != 0);
  return num_digits;
}

Assistant:

FMT_CONSTEXPR auto count_digits(UInt n) -> int {
#ifdef FMT_BUILTIN_CLZ
  if (num_bits<UInt>() == 32)
    return (FMT_BUILTIN_CLZ(static_cast<uint32_t>(n) | 1) ^ 31) / BITS + 1;
#endif
  int num_digits = 0;
  do {
    ++num_digits;
  } while ((n >>= BITS) != 0);
  return num_digits;
}